

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>_> __thiscall
kj::
heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>>,kj::Maybe<kj::HttpHeaders::Request>>
          (kj *this,Maybe<kj::HttpHeaders::Request> *params)

{
  ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> *this_00;
  Maybe<kj::HttpHeaders::Request> *value;
  ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> *extraout_RDX;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>_> OVar1;
  ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_> local_1a0;
  NoInfer<kj::Maybe<kj::HttpHeaders::Request>_> *local_18;
  Maybe<kj::HttpHeaders::Request> *params_local;
  
  local_18 = params;
  params_local = (Maybe<kj::HttpHeaders::Request> *)this;
  this_00 = (ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> *)operator_new(400);
  value = fwd<kj::Maybe<kj::HttpHeaders::Request>>(local_18);
  _::ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_>::ExceptionOr(&local_1a0,value);
  _::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>::ImmediatePromiseNode
            (this_00,&local_1a0);
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>_>::Own
            ((Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>_> *)this,this_00
             ,(Disposer *)
              &_::HeapDisposer<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>>>::
               instance);
  _::ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_>::~ExceptionOr(&local_1a0);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}